

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O2

jint Java_beagle_BeagleJNIWrapper_addTransitionMatrices
               (JNIEnv *env,jobject obj,jint instance,jintArray inFirstIndices,
               jintArray inSecondIndices,jintArray inResultIndices,jint matrixCount)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  
  pjVar2 = (*env->functions->GetIntArrayElements)(env,inFirstIndices,(jboolean *)0x0);
  pjVar3 = (*env->functions->GetIntArrayElements)(env,inSecondIndices,(jboolean *)0x0);
  pjVar4 = (*env->functions->GetIntArrayElements)(env,inResultIndices,(jboolean *)0x0);
  jVar1 = beagleAddTransitionMatrices(instance,pjVar2,pjVar3,pjVar4,matrixCount);
  (*env->functions->ReleaseIntArrayElements)(env,inFirstIndices,pjVar2,2);
  (*env->functions->ReleaseIntArrayElements)(env,inSecondIndices,pjVar3,2);
  (*env->functions->ReleaseIntArrayElements)(env,inResultIndices,pjVar4,2);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_addTransitionMatrices
        (JNIEnv *env, jobject obj, jint instance, jintArray inFirstIndices, jintArray inSecondIndices, jintArray inResultIndices, jint matrixCount)
{
    jint errCode;

    jint *firstIndices = env->GetIntArrayElements(inFirstIndices, NULL);
    jint *secondIndices = env->GetIntArrayElements(inSecondIndices, NULL);
    jint *resultIndices = env->GetIntArrayElements(inResultIndices, NULL);

    errCode = (jint)beagleAddTransitionMatrices(instance, (int *)firstIndices, (int *)secondIndices, (int *)resultIndices, matrixCount);

    env->ReleaseIntArrayElements(inFirstIndices, firstIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inSecondIndices, secondIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inResultIndices, resultIndices, JNI_ABORT);

    return errCode;
}